

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.hpp
# Opt level: O0

fixed_precise_measurement * __thiscall
units::fixed_precise_measurement::operator=
          (fixed_precise_measurement *this,precise_measurement *val)

{
  bool bVar1;
  double local_48;
  precise_unit local_28;
  precise_measurement *local_18;
  precise_measurement *val_local;
  fixed_precise_measurement *this_local;
  
  local_18 = val;
  val_local = (precise_measurement *)this;
  local_28 = precise_measurement::units(val);
  bVar1 = precise_unit::operator==(&this->units_,&local_28);
  if (bVar1) {
    local_48 = precise_measurement::value(local_18);
  }
  else {
    local_48 = precise_measurement::value_as(local_18,&this->units_);
  }
  this->value_ = local_48;
  return this;
}

Assistant:

fixed_precise_measurement&
        operator=(const precise_measurement& val) noexcept
    {
        value_ = (units_ == val.units()) ? val.value() : val.value_as(units_);
        return *this;
    }